

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_lobster.cpp
# Opt level: O2

string * __thiscall
flatbuffers::lobster::LobsterGenerator::LobsterType_abi_cxx11_
          (string *__return_storage_ptr__,LobsterGenerator *this,Type *type)

{
  BaseType BVar1;
  allocator<char> *__a;
  char *__s;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  BVar1 = type->base_type;
  if (BVar1 - BASE_TYPE_FLOAT < 2) {
    __s = "float";
    __a = &local_9;
  }
  else if (BVar1 == BASE_TYPE_BOOL) {
    __s = "bool";
    __a = &local_a;
  }
  else if (BVar1 - BASE_TYPE_UTYPE < 0xc) {
    if (type->enum_def != (EnumDef *)0x0) {
      EscapeKeyword(__return_storage_ptr__,this,(string *)type->enum_def);
      return __return_storage_ptr__;
    }
    __s = "int";
    __a = &local_c;
  }
  else {
    __s = "flatbuffers.offset";
    __a = &local_b;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string LobsterType(const Type &type) {
    if (IsFloat(type.base_type)) return "float";
    if (IsBool(type.base_type)) return "bool";
    if (IsScalar(type.base_type) && type.enum_def)
      return NormalizedName(*type.enum_def);
    if (!IsScalar(type.base_type)) return "flatbuffers.offset";
    if (IsString(type)) return "string";
    return "int";
  }